

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

bool A_RaiseMobj(AActor *actor,double speed)

{
  bool local_19;
  bool done;
  double speed_local;
  AActor *actor_local;
  
  local_19 = true;
  if (0.0 < actor->Floorclip) {
    actor->Floorclip = actor->Floorclip - speed;
    local_19 = actor->Floorclip <= 0.0;
    if (local_19) {
      actor->Floorclip = 0.0;
    }
  }
  return local_19;
}

Assistant:

bool A_RaiseMobj (AActor *actor, double speed)
{
	bool done = true;

	// Raise a mobj from the ground
	if (actor->Floorclip > 0)
	{
		actor->Floorclip -= speed;
		if (actor->Floorclip <= 0)
		{
			actor->Floorclip = 0;
			done = true;
		}
		else
		{
			done = false;
		}
	}
	return done;		// Reached target height
}